

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerManager.cpp
# Opt level: O0

int __thiscall ztimer::TimerManager::UnRegisterTimer(TimerManager *this,unsigned_long timerId)

{
  bool bVar1;
  mapped_type *pmVar2;
  _Node_iterator_base<std::pair<const_unsigned_long,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_false>
  this_00;
  unsigned_long in_RSI;
  TimerManager *in_RDI;
  uint pos;
  lock_guard<std::mutex> lk;
  unordered_map<unsigned_long,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
  *in_stack_ffffffffffffff88;
  unordered_map<unsigned_long,_unsigned_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>_>
  *in_stack_ffffffffffffff90;
  unsigned_long in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  _Node_iterator_base<std::pair<const_unsigned_long,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_false>
  local_48;
  _Node_iterator_base<std::pair<const_unsigned_long,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_false>
  local_40;
  mapped_type local_34;
  undefined4 local_30;
  unsigned_long local_18;
  int local_4;
  
  local_18 = in_RSI;
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_stack_ffffffffffffff90,
             (mutex_type *)in_stack_ffffffffffffff88);
  bVar1 = TimerValid(in_RDI,local_18);
  if ((bVar1) &&
     (bVar1 = TimerExist((TimerManager *)
                         CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
                         in_stack_ffffffffffffff98), bVar1)) {
    pmVar2 = std::
             unordered_map<unsigned_long,_unsigned_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>_>
             ::operator[](in_stack_ffffffffffffff90,(key_type *)in_stack_ffffffffffffff88);
    local_34 = *pmVar2;
    std::
    unordered_map<unsigned_long,_unsigned_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>_>
    ::erase(in_stack_ffffffffffffff90,(key_type *)in_stack_ffffffffffffff88);
    this_00._M_cur =
         (__node_type *)
         std::
         unordered_map<unsigned_long,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
         ::find(in_stack_ffffffffffffff88,(key_type *)0x180b96);
    local_40._M_cur = this_00._M_cur;
    local_48._M_cur =
         (__node_type *)
         std::
         unordered_map<unsigned_long,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
         ::end(in_stack_ffffffffffffff88);
    bVar1 = std::__detail::operator!=(&local_40,&local_48);
    if (bVar1) {
      std::
      unordered_map<unsigned_long,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
      ::erase((unordered_map<unsigned_long,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
               *)this_00._M_cur,(key_type *)in_stack_ffffffffffffff88);
    }
    std::
    vector<std::unordered_map<unsigned_long,_std::array<unsigned_int,_3UL>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>_>_>,_std::allocator<std::unordered_map<unsigned_long,_std::array<unsigned_int,_3UL>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>_>_>_>_>
    ::operator[](&in_RDI->timeWheel,(ulong)local_34);
    std::
    unordered_map<unsigned_long,_std::array<unsigned_int,_3UL>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>_>_>
    ::erase((unordered_map<unsigned_long,_std::array<unsigned_int,_3UL>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>_>_>
             *)this_00._M_cur,(key_type *)in_stack_ffffffffffffff88);
    local_4 = 0;
  }
  else {
    local_4 = 4;
  }
  local_30 = 1;
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x180c23);
  return local_4;
}

Assistant:

int TimerManager::UnRegisterTimer(unsigned long timerId)
    {
        std::lock_guard<std::mutex> lk(mtx);
        if (!TimerValid(timerId) || !TimerExist(timerId)) {
            return ERR_TIMER_ID_INVALID_NOT_EXIST;
        }
        unsigned int pos = timerMap[timerId];
        timerMap.erase(timerId);
        if (AbsTimerMap.find(timerId) != AbsTimerMap.end()) {
            AbsTimerMap.erase(timerId);
        }
        timeWheel[pos].erase(timerId);
        return ERR_OK;
    }